

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreDisassembler.c
# Opt level: O0

DecodeStatus DecodeRUSSrcDstBitpInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  MCInst *in_RCX;
  uint *in_RDX;
  undefined4 in_ESI;
  uint in_EDI;
  DecodeStatus S;
  uint Op2;
  uint Op1;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  uint RegNo;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 local_4;
  
  local_4 = Decode2OpInstruction(in_EDI,(uint *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX);
  RegNo = (uint)((ulong)in_RDX >> 0x20);
  if (local_4 == MCDisassembler_Success) {
    DecodeGRRegsRegisterClass
              ((MCInst *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),RegNo,(uint64_t)in_RCX,
               (void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    DecodeGRRegsRegisterClass
              ((MCInst *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),RegNo,(uint64_t)in_RCX,
               (void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    DecodeBitpOperand(in_RCX,in_stack_ffffffffffffffd4,CONCAT44(local_4,in_stack_ffffffffffffffc8),
                      (void *)0x37e7db);
  }
  else {
    local_4 = Decode2OpInstructionFail
                        ((MCInst *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),RegNo,(uint64_t)in_RCX
                         ,(void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeRUSSrcDstBitpInstruction(MCInst *Inst, unsigned Insn, uint64_t Address,
		const void *Decoder)
{
	unsigned Op1, Op2;
	DecodeStatus S = Decode2OpInstruction(Insn, &Op1, &Op2);
	if (S != MCDisassembler_Success)
		return Decode2OpInstructionFail(Inst, Insn, Address, Decoder);

	DecodeGRRegsRegisterClass(Inst, Op1, Address, Decoder);
	DecodeGRRegsRegisterClass(Inst, Op1, Address, Decoder);
	DecodeBitpOperand(Inst, Op2, Address, Decoder);

	return S;
}